

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDTree.hpp
# Opt level: O0

void __thiscall
kdtree::
KDTree<int,_5U,_kdtree::default_new<int,_5>,_kdtree::default_delete<int>,_kdtree::default_set<int>,_kdtree::default_less<int>_>
::KDTree(KDTree<int,_5U,_kdtree::default_new<int,_5>,_kdtree::default_delete<int>,_kdtree::default_set<int>,_kdtree::default_less<int>_>
         *this,vector<int_*,_std::allocator<int_*>_> *values)

{
  bool bVar1;
  int *piVar2;
  reference ppiVar3;
  Node *pNVar4;
  default_set<int> local_22;
  default_set<int> local_21;
  uint local_20;
  default_new<int,_5> local_1a;
  default_new<int,_5> local_19;
  int d;
  vector<int_*,_std::allocator<int_*>_> *values_local;
  KDTree<int,_5U,_kdtree::default_new<int,_5>,_kdtree::default_delete<int>,_kdtree::default_set<int>,_kdtree::default_less<int>_>
  *this_local;
  
  _d = values;
  values_local = (vector<int_*,_std::allocator<int_*>_> *)this;
  piVar2 = default_new<int,_5>::operator()(&local_19);
  this->boundingBoxMin = piVar2;
  piVar2 = default_new<int,_5>::operator()(&local_1a);
  this->boundingBoxMax = piVar2;
  bVar1 = std::vector<int_*,_std::allocator<int_*>_>::empty(values);
  if (bVar1) {
    this->root = (Node *)0x0;
  }
  else {
    for (local_20 = 0; local_20 < 5; local_20 = local_20 + 1) {
      piVar2 = this->boundingBoxMin;
      ppiVar3 = std::vector<int_*,_std::allocator<int_*>_>::operator[](values,0);
      default_set<int>::operator()(&local_21,piVar2,*ppiVar3,local_20);
      piVar2 = this->boundingBoxMax;
      ppiVar3 = std::vector<int_*,_std::allocator<int_*>_>::operator[](values,0);
      default_set<int>::operator()(&local_22,piVar2,*ppiVar3,local_20);
    }
    pNVar4 = buildKDTree(this,values,0);
    this->root = pNVar4;
  }
  return;
}

Assistant:

KDTree(std::vector<T*> values) {
			if (values.empty()) {
				root = nullptr;
			}
			else {
				for (int d = 0; d < dim; d++) {
					SET()(boundingBoxMin, values[0], d);
					SET()(boundingBoxMax, values[0], d);
				}
				root = buildKDTree(values);
			}
		}